

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::_::BTreeImpl::merge(BTreeImpl *this,Leaf *dst,uint dstPos,uint pivot,Leaf *src)

{
  bool bVar1;
  Fault local_90;
  Fault f_2;
  undefined1 local_80 [8];
  DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_unsigned_int_&> _kjCondition_2;
  size_t mid;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  Fault local_38;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Leaf *src_local;
  uint pivot_local;
  uint dstPos_local;
  Leaf *dst_local;
  BTreeImpl *this_local;
  
  src_local._0_4_ = pivot;
  src_local._4_4_ = dstPos;
  _pivot_local = dst;
  dst_local = (Leaf *)this;
  f.exception._6_1_ = Leaf::isHalfFull(src);
  f.exception._7_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7));
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x283,FAILED,"src.isHalfFull()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f.exception + 7));
    Debug::Fault::fatal(&local_38);
  }
  f_1.exception._2_1_ = Leaf::isHalfFull(_pivot_local);
  f_1.exception._3_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 2));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f_1.exception + 3));
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&mid,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x284,FAILED,"dst.isHalfFull()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f_1.exception + 3));
    Debug::Fault::fatal((Fault *)&mid);
  }
  _kjCondition_2.result = true;
  _kjCondition_2._33_7_ = 0;
  f_2.exception =
       (Exception *)
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,_pivot_local->rows + 6);
  DebugExpression<kj::_::BTreeImpl::MaybeUint&>::operator==
            ((DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_unsigned_int_&> *)local_80,
             (DebugExpression<kj::_::BTreeImpl::MaybeUint&> *)&f_2,(uint *)&src_local);
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
  if (!bVar1) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::BTreeImpl::MaybeUint&,unsigned_int&>&>
              (&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x287,FAILED,"dst.rows[mid-1] == pivot","_kjCondition,",
               (DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_unsigned_int_&> *)local_80);
    Debug::Fault::fatal(&local_90);
  }
  acopy<kj::_::BTreeImpl::MaybeUint>(_pivot_local->rows + 7,src->rows,7);
  _pivot_local->next = src->next;
  if (_pivot_local->next == 0) {
    this->endLeaf = src_local._4_4_;
  }
  else {
    this->tree[_pivot_local->next].field_0.freelist.zero[0] = src_local._4_4_;
  }
  return;
}

Assistant:

void BTreeImpl::merge(Leaf& dst, uint dstPos, uint pivot, Leaf& src) {
  // merge() is only legal if both nodes are half-empty. Meanwhile, B-tree invariants
  // guarantee that the node can't be more than half-empty, or we would have merged it sooner.
  // (The root can be more than half-empty, but it is never merged with anything.)
  KJ_DASSERT(src.isHalfFull());
  KJ_DASSERT(dst.isHalfFull());

  constexpr size_t mid = Leaf::NROWS/2;
  KJ_DASSERT(dst.rows[mid-1] == pivot);
  acopy(dst.rows + mid, src.rows, mid);

  dst.next = src.next;
  if (dst.next == 0) {
    endLeaf = dstPos;
  } else {
    tree[dst.next].leaf.prev = dstPos;
  }
}